

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningAgent.cpp
# Opt level: O1

void __thiscall
multi_agent_planning::idp_visitor<unsigned_long>::
examine_vertex<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>const>
          (idp_visitor<unsigned_long> *this,unsigned_long u,
          adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
          *g)

{
  pointer psVar1;
  pointer puVar2;
  undefined8 uVar3;
  unsigned_long uVar4;
  unsigned_long local_40;
  undefined8 *local_38;
  
  if (this->m_goal != u) {
    *this->time = 0;
    uVar4 = (this->p->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[u];
    if (uVar4 != u) {
      do {
        psVar1 = (g->super_type).m_vertices.
                 super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_40 = u;
        local_38 = (undefined8 *)operator_new(8);
        *local_38 = 0;
        std::
        __find_if<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,multi_agent_planning::Action>const*,std::vector<boost::detail::stored_edge_property<unsigned_long,multi_agent_planning::Action>,std::allocator<boost::detail::stored_edge_property<unsigned_long,multi_agent_planning::Action>>>>,__gnu_cxx::__ops::_Iter_equals_val<boost::detail::stored_edge_property<unsigned_long,multi_agent_planning::Action>const>>
                  (*(undefined8 *)
                    &psVar1[uVar4].super_StoredVertex.m_out_edges.
                     super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_>_>
                   ,*(pointer *)
                     ((long)&psVar1[uVar4].super_StoredVertex.m_out_edges.
                             super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_>_>
                     + 8),&local_40);
        if (local_38 != (undefined8 *)0x0) {
          operator_delete(local_38);
        }
        *this->time = *this->time + 1;
        puVar2 = (this->p->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        u = puVar2[u];
        uVar4 = puVar2[u];
      } while (u != uVar4);
    }
    return;
  }
  uVar3 = __cxa_allocate_exception(1);
  __cxa_throw(uVar3,&found_goal::typeinfo,0);
}

Assistant:

void examine_vertex(Vertex u, Graph& g) {
    if(u == m_goal)
      throw found_goal();
    
    time = 0;
    for (Vertex v = u; v != p[v]; v = p[v]) {
    	Vertex s = p[v];
    	Edge e = edge(s, v, g).first;
    	time++;
    }
  }